

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void __thiscall ctemplate::BaseArena::~BaseArena(BaseArena *this)

{
  int local_14;
  int i;
  BaseArena *this_local;
  
  this->_vptr_BaseArena = (_func_int **)&PTR__BaseArena_001b5ba0;
  FreeBlocks(this);
  if (this->overflow_blocks_ ==
      (vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
       *)0x0) {
    for (local_14 = this->first_block_we_own_; local_14 < this->blocks_alloced_;
        local_14 = local_14 + 1) {
      free(this->first_blocks_[local_14].mem);
    }
    return;
  }
  __assert_fail("overflow_blocks_ == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/base/arena.cc"
                ,0x8b,"virtual ctemplate::BaseArena::~BaseArena()");
}

Assistant:

BaseArena::~BaseArena() {
  FreeBlocks();
  assert(overflow_blocks_ == NULL);    // FreeBlocks() should do that
  // The first X blocks stay allocated always by default.  Delete them now.
  for ( int i = first_block_we_own_; i < blocks_alloced_; ++i )
    free(first_blocks_[i].mem);
}